

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorAngle.cpp
# Opt level: O3

void __thiscall
chrono::ChShaftsMotorAngle::ArchiveOUT(ChShaftsMotorAngle *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChShaftsMotorAngle>(marchive);
  ChShaftsMotorBase::ArchiveOUT(&this->super_ChShaftsMotorBase,marchive);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->motor_torque;
  local_38._name = "motor_torque";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->rot_offset;
  local_38._name = "this->rot_offset";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = &this->f_rot;
  local_38._name = "this->f_rot";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFunction>(marchive,&local_38);
  return;
}

Assistant:

void ChShaftsMotorAngle::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChShaftsMotorAngle>();

    // serialize parent class
    ChShaftsMotorBase::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(motor_torque);
    marchive << CHNVP(this->rot_offset);
    marchive << CHNVP(this->f_rot);

}